

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_facade(void)

{
  Computer computer;
  allocator local_2c;
  Computer local_2b;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"facade",(allocator *)&local_2b);
  print_func_begin(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  facade::Computer::PowerOn(&local_2b);
  std::__cxx11::string::string((string *)&local_28,"facade",&local_2c);
  print_func_end(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void test_facade() {
    print_func_begin("facade");
    facade::Computer computer;
    computer.PowerOn();

    print_func_end("facade");
}